

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall
Memory::Recycler::ProcessObjectBeforeCollectCallbacks(Recycler *this,bool atShutdown)

{
  ObjectBeforeCollectCallbackList *pOVar1;
  void *address;
  code *pcVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  undefined7 extraout_var;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  **ppSVar7;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar8;
  undefined1 local_98 [8];
  EditingIterator iter;
  AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>
  autoInObjectBeforeCollectCallback;
  Iterator local_60;
  undefined1 local_50 [8];
  AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
  oldCallbackList;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pOVar1 = this->objectBeforeCollectCallbackList;
  if (pOVar1 == (ObjectBeforeCollectCallbackList *)0x0) goto LAB_00681c49;
  if ((!atShutdown) &&
     (((this->collectionState).value & CollectionStateMark) == CollectionStateNotCollecting)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2345,"(atShutdown || this->IsMarkState())",
                       "atShutdown || this->IsMarkState()");
    if (!bVar4) goto LAB_00681ce6;
    *puVar5 = 0;
  }
  if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2347,"(!this->IsInObjectBeforeCollectCallback())",
                       "!this->IsInObjectBeforeCollectCallback()");
    if (!bVar4) {
LAB_00681ce6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  iter.super_EditingIterator.last._0_4_ = atShutdown + ObjectBeforeCollectCallback_Normal;
  this->objectBeforeCollectCallbackState =
       (ObjectBeforeCollectCallbackState)iter.super_EditingIterator.last;
  local_50 = (undefined1  [8])this->objectBeforeCollectCallbackList;
  oldCallbackList.
  super_BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
  .ptr = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          *)&this->objectBeforeCollectCallbackArena;
  this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)0x0;
  local_98 = (undefined1  [8])
             BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
             ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                           *)local_50);
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  oldCallbackList.m_allocator._4_4_ = 0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        *)local_98;
LAB_00681ac2:
  do {
    bVar4 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_98);
    auVar3 = local_50;
    if (!bVar4) break;
    pTVar6 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_98);
    if (pTVar6->callback != (ObjectBeforeCollectCallback)0x0) {
      address = pTVar6->object;
      if ((!atShutdown) && (bVar4 = HeapBlockMap64::IsMarked(&this->heapBlockMap,address), bVar4)) {
        oldCallbackList.m_allocator._4_4_ = (uint)CONCAT71(extraout_var,1);
        goto LAB_00681ac2;
      }
      if (pTVar6->callbackWrapper == (ObjectBeforeCollectCallbackWrapper)0x0) {
        (*pTVar6->callback)(address,pTVar6->callbackState);
      }
      else {
        (*pTVar6->callbackWrapper)
                  (pTVar6->callback,address,pTVar6->callbackState,pTVar6->threadContext);
      }
    }
    SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
    EditingIterator::RemoveCurrent((EditingIterator *)local_98);
  } while( true );
  if ((oldCallbackList.m_allocator._4_4_ & 1) != 0) {
    pSVar8 = this->objectBeforeCollectCallbackList;
    local_50 = (undefined1  [8])0x0;
    if (pSVar8 == (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   *)0x0) {
      this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)auVar3;
    }
    else {
      ppSVar7 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                ::operator&((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                             *)local_50);
      *ppSVar7 = pSVar8;
      this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)auVar3;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&oldCallbackList.m_allocator,
                 ExceptionType_OutOfMemory);
      pSVar8 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
               ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                             *)local_50);
      local_60.list =
           &pSVar8->
            super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ;
      local_60.current = (NodeBase *)pSVar8;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        if (pSVar8 == (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                       *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) goto LAB_00681ce6;
          *puVar5 = 0;
          pSVar8 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                    *)local_60.current;
        }
        pSVar8 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  *)(pSVar8->
                    super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                    ).super_SListNodeBase<Memory::ArenaAllocator>.next;
        if (pSVar8 == (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                       *)local_60.list) break;
        local_60.current = (NodeBase *)pSVar8;
        pTVar6 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                 ::Iterator::Data(&local_60);
        SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        ::Prepend(this->objectBeforeCollectCallbackList,pTVar6);
        pSVar8 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  *)local_60.current;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&oldCallbackList.m_allocator);
    }
  }
  AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
  ::~AutoAllocatorObjectPtr
            ((AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
              *)local_50);
  AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>::~AutoRestoreValue
            ((AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState> *)
             &iter.super_EditingIterator.last);
LAB_00681c49:
  return pOVar1 != (ObjectBeforeCollectCallbackList *)0x0;
}

Assistant:

bool Recycler::ProcessObjectBeforeCollectCallbacks(bool atShutdown/*= false*/)
{
    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        return false; // no callbacks
    }
    Assert(atShutdown || this->IsMarkState());

    Assert(!this->IsInObjectBeforeCollectCallback());
    AutoRestoreValue<ObjectBeforeCollectCallbackState> autoInObjectBeforeCollectCallback(&objectBeforeCollectCallbackState,
        atShutdown ? ObjectBeforeCollectCallback_Shutdown : ObjectBeforeCollectCallback_Normal);

    // The callbacks may register/unregister callbacks while we are enumerating the current map. To avoid
    // conflicting usage of the callback map, we swap it out. New registration will go to a new map.
    AutoAllocatorObjectPtr<ObjectBeforeCollectCallbackList, ArenaAllocator> oldCallbackList(
        this->objectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    this->objectBeforeCollectCallbackList = nullptr;

    bool hasRemainingCallbacks = false;
    FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, data, oldCallbackList, iter)
    {
        bool remove = true;
        if (data.callback != nullptr)
        {
            void* object = data.object;
            if (atShutdown || !this->IsObjectMarked(object))
            {
                if (data.callbackWrapper != nullptr)
                {
                    data.callbackWrapper(data.callback, object, data.callbackState, data.threadContext);
                }
                else
                {
                    data.callback(object, data.callbackState);
                }
            }
            else
            {
                hasRemainingCallbacks = true;
                remove = false; // Do not remove this entry, remaining callback for future
            }
        }
        if (remove)
        {
            iter.RemoveCurrent();
        }
    } NEXT_SLIST_ENTRY_EDITING;

    // Merge back remaining callbacks if any
    if (hasRemainingCallbacks)
    {
        if (this->objectBeforeCollectCallbackList == nullptr)
        {
            this->objectBeforeCollectCallbackList = oldCallbackList.Detach();
        }
        else
        {
            // Swap back, since old list is likely larger
            ObjectBeforeCollectCallbackList* tmp = oldCallbackList.Detach();
            *&oldCallbackList = this->objectBeforeCollectCallbackList;
            this->objectBeforeCollectCallbackList = tmp;

            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
                oldCallbackList->Map([&](const ObjectBeforeCollectCallbackData& data)
                {
                    this->objectBeforeCollectCallbackList->Push(data);
                });
            }
            catch (Js::OutOfMemoryException)
            {
                // can't recover from OOM here
                AssertOrFailFast(UNREACHED);
            }
        }
    }

    return true; // maybe called callbacks
}